

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O0

int ngx_http_status(http_parser *p,char *buf,size_t len)

{
  size_t len_local;
  char *buf_local;
  http_parser *p_local;
  
  if (p == parser) {
    memcpy(&state,buf,len);
    p_local._4_4_ = 0;
  }
  else {
    if (3 < ngx_cycle->log->log_level) {
      ngx_log_error_core(4,ngx_cycle->log,0,"ngx_http_status: parser argument is wrong");
    }
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

static int
ngx_http_status(http_parser *p, const char *buf, size_t len)
{
    if (p != parser) {
        ngx_log_error(NGX_LOG_ERR, ngx_cycle->log, 0,
                      "ngx_http_status: parser argument is wrong");
        return NGX_ERROR;
    }

    ngx_memcpy(state.status, buf, len);

    return 0;
}